

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O1

void __thiscall Imf_3_4::DeepTiledOutputFile::initialize(DeepTiledOutputFile *this,Header *header)

{
  int maxX;
  int minY;
  int maxY;
  Data *pDVar1;
  ulong uVar2;
  char *pcVar3;
  LevelMode LVar4;
  LevelRoundingMode LVar5;
  uint uVar6;
  int iVar7;
  Format FVar8;
  LineOrder *pLVar9;
  TileDescription *pTVar10;
  Box2i *pBVar11;
  Compression *pCVar12;
  Compressor *pCVar13;
  TileBuffer *pTVar14;
  char *pcVar15;
  ArgExc *this_00;
  ulong uVar16;
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_1c8;
  stringstream _iex_throw_s;
  int iStack_1ac;
  int local_1a8;
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  local_1a0 [15];
  
  Header::operator=(&this->_data->header,header);
  Header::setType(&this->_data->header,(string *)&DEEPTILE_abi_cxx11_);
  pLVar9 = Header::lineOrder(&this->_data->header);
  pDVar1 = this->_data;
  pDVar1->lineOrder = *pLVar9;
  pTVar10 = Header::tileDescription(&pDVar1->header);
  pDVar1 = this->_data;
  uVar6 = pTVar10->ySize;
  LVar4 = pTVar10->mode;
  LVar5 = pTVar10->roundingMode;
  (pDVar1->tileDesc).xSize = pTVar10->xSize;
  (pDVar1->tileDesc).ySize = uVar6;
  (pDVar1->tileDesc).mode = LVar4;
  (pDVar1->tileDesc).roundingMode = LVar5;
  pBVar11 = Header::dataWindow(&this->_data->header);
  iVar7 = (pBVar11->min).x;
  pDVar1 = this->_data;
  pDVar1->minX = iVar7;
  maxX = (pBVar11->max).x;
  pDVar1->maxX = maxX;
  minY = (pBVar11->min).y;
  pDVar1->minY = minY;
  maxY = (pBVar11->max).y;
  pDVar1->maxY = maxY;
  uVar6 = (pDVar1->tileDesc).xSize * (pDVar1->tileDesc).ySize;
  pDVar1->maxSampleCountTableSize = (ulong)uVar6 * 4;
  if (uVar6 < 0x40000000) {
    precalculateTileInfo
              (&pDVar1->tileDesc,iVar7,maxX,minY,maxY,&pDVar1->numXTiles,&pDVar1->numYTiles,
               &pDVar1->numXLevels,&pDVar1->numYLevels);
    pDVar1 = this->_data;
    if (pDVar1->lineOrder == INCREASING_Y) {
      iVar7 = 0;
    }
    else {
      iVar7 = *pDVar1->numYTiles + -1;
    }
    (pDVar1->nextTileToWrite).dx = 0;
    (pDVar1->nextTileToWrite).dy = iVar7;
    (pDVar1->nextTileToWrite).lx = 0;
    (pDVar1->nextTileToWrite).ly = 0;
    pCVar12 = Header::compression(&pDVar1->header);
    pCVar13 = newTileCompressor(*pCVar12,0,(ulong)(this->_data->tileDesc).ySize,&this->_data->header
                               );
    FVar8 = defaultFormat(pCVar13);
    this->_data->format = FVar8;
    if (pCVar13 != (Compressor *)0x0) {
      (*pCVar13->_vptr_Compressor[1])(pCVar13);
    }
    pDVar1 = this->_data;
    TileOffsets::TileOffsets
              ((TileOffsets *)&_iex_throw_s,(pDVar1->tileDesc).mode,pDVar1->numXLevels,
               pDVar1->numYLevels,pDVar1->numXTiles,pDVar1->numYTiles);
    pDVar1 = this->_data;
    (pDVar1->tileOffsets)._numYLevels = local_1a8;
    (pDVar1->tileOffsets)._mode = __iex_throw_s;
    (pDVar1->tileOffsets)._numXLevels = iStack_1ac;
    local_1c8.
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pDVar1->tileOffsets)._offsets.
         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_1c8.
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pDVar1->tileOffsets)._offsets.
         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_1c8.
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pDVar1->tileOffsets)._offsets.
         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (pDVar1->tileOffsets)._offsets.
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_1a0[0].
         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (pDVar1->tileOffsets)._offsets.
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_1a0[0].
         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (pDVar1->tileOffsets)._offsets.
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_1a0[0].
         super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1a0[0].
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a0[0].
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a0[0].
    super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::~vector(&local_1c8);
    std::
    vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
    ::~vector(local_1a0);
    pDVar1 = this->_data;
    iVar7 = getChunkOffsetTableSize(&pDVar1->header);
    Header::setChunkCount(&pDVar1->header,iVar7);
    if ((this->_data->tileBuffers).
        super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->_data->tileBuffers).
        super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar16 = 0;
      do {
        pTVar14 = (TileBuffer *)operator_new(0xb8);
        (pTVar14->buffer)._size = 0;
        (pTVar14->buffer)._data = (char *)0x0;
        pTVar14->dataPtr = (char *)0x0;
        pTVar14->dataSize = 0;
        pTVar14->compressor = (Compressor *)0x0;
        (pTVar14->sampleCountTableBuffer)._size = 0;
        (pTVar14->sampleCountTableBuffer)._data = (char *)0x0;
        pTVar14->sampleCountTablePtr = (char *)0x0;
        pTVar14->sampleCountTableCompressor = (Compressor *)0x0;
        (pTVar14->tileCoord).dx = 0;
        (pTVar14->tileCoord).dy = 0;
        *(undefined8 *)((long)&(pTVar14->tileCoord).dx + 1) = 0;
        *(undefined8 *)((long)&(pTVar14->tileCoord).lx + 1) = 0;
        (pTVar14->exception)._M_dataplus._M_p = (pointer)&(pTVar14->exception).field_2;
        (pTVar14->exception)._M_string_length = 0;
        (pTVar14->exception).field_2._M_local_buf[0] = '\0';
        IlmThread_3_4::Semaphore::Semaphore(&pTVar14->_sem,1);
        (this->_data->tileBuffers).
        super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar16] = pTVar14;
        uVar2 = this->_data->maxSampleCountTableSize;
        pTVar14 = (this->_data->tileBuffers).
                  super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar16];
        pcVar15 = (char *)operator_new__(uVar2);
        pcVar3 = (pTVar14->sampleCountTableBuffer)._data;
        if (pcVar3 != (char *)0x0) {
          operator_delete__(pcVar3);
        }
        (pTVar14->sampleCountTableBuffer)._size = uVar2;
        (pTVar14->sampleCountTableBuffer)._data = pcVar15;
        memset(((this->_data->tileBuffers).
                super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar16]->sampleCountTableBuffer)._data,0,
               this->_data->maxSampleCountTableSize);
        pCVar12 = Header::compression(&this->_data->header);
        pCVar13 = newCompressor(*pCVar12,this->_data->maxSampleCountTableSize,&this->_data->header);
        (this->_data->tileBuffers).
        super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar16]->sampleCountTableCompressor = pCVar13;
        uVar16 = uVar16 + 1;
      } while (uVar16 < (ulong)((long)(this->_data->tileBuffers).
                                      super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->_data->tileBuffers).
                                      super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"Deep tile size exceeds maximum permitted area",0x2d);
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,(stringstream *)&_iex_throw_s);
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
DeepTiledOutputFile::initialize (const Header& header)
{
    _data->header = header;
    _data->header.setType (DEEPTILE);
    _data->lineOrder = _data->header.lineOrder ();

    //
    // Check that the file is indeed tiled
    //

    _data->tileDesc = _data->header.tileDescription ();

    //
    // Save the dataWindow information
    //

    const Box2i& dataWindow = _data->header.dataWindow ();
    _data->minX             = dataWindow.min.x;
    _data->maxX             = dataWindow.max.x;
    _data->minY             = dataWindow.min.y;
    _data->maxY             = dataWindow.max.y;

    _data->maxSampleCountTableSize =
        _data->tileDesc.ySize * _data->tileDesc.xSize * sizeof (int);

    //
    // impose limit of 2^32 bytes of storage for maxSampleCountTableSize
    // (disallow files with very large tile areas that would otherwise cause excessive memory allocation)
    //

    if (_data->maxSampleCountTableSize >
        std::numeric_limits<unsigned int>::max ())
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Deep tile size exceeds maximum permitted area");
    }

    //
    // Precompute level and tile information to speed up utility functions
    //

    precalculateTileInfo (
        _data->tileDesc,
        _data->minX,
        _data->maxX,
        _data->minY,
        _data->maxY,
        _data->numXTiles,
        _data->numYTiles,
        _data->numXLevels,
        _data->numYLevels);

    //
    // Determine the first tile coordinate that we will be writing
    // if the file is not RANDOM_Y.
    //

    _data->nextTileToWrite = (_data->lineOrder == INCREASING_Y)
                                 ? TileCoord (0, 0, 0, 0)
                                 : TileCoord (0, _data->numYTiles[0] - 1, 0, 0);

    Compressor* compressor = newTileCompressor (
        _data->header.compression (), 0, _data->tileDesc.ySize, _data->header);

    _data->format = defaultFormat (compressor);

    if (compressor != 0) delete compressor;

    _data->tileOffsets = TileOffsets (
        _data->tileDesc.mode,
        _data->numXLevels,
        _data->numYLevels,
        _data->numXTiles,
        _data->numYTiles);

    //ignore the existing value of chunkCount - correct it if it's wrong
    _data->header.setChunkCount (getChunkOffsetTableSize (_data->header));

    for (size_t i = 0; i < _data->tileBuffers.size (); i++)
    {
        _data->tileBuffers[i] = new TileBuffer ();

        _data->tileBuffers[i]->sampleCountTableBuffer.resizeErase (
            static_cast<long> (_data->maxSampleCountTableSize));

        char* p = &(_data->tileBuffers[i]->sampleCountTableBuffer[0]);
        memset (p, 0, _data->maxSampleCountTableSize);

        _data->tileBuffers[i]->sampleCountTableCompressor = newCompressor (
            _data->header.compression (),
            _data->maxSampleCountTableSize,
            _data->header);
    }
}